

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O2

int __thiscall ncnn::Eltwise::load_param(Eltwise *this,ParamDict *pd)

{
  int iVar1;
  Mat MStack_98;
  Mat local_58;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->op_type = iVar1;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&MStack_98,pd,1,&local_58);
  Mat::operator=(&this->coeffs,&MStack_98);
  Mat::~Mat(&MStack_98);
  Mat::~Mat(&local_58);
  return 0;
}

Assistant:

int Eltwise::load_param(const ParamDict& pd)
{
    op_type = pd.get(0, 0);
    coeffs = pd.get(1, Mat());

    return 0;
}